

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void bench_callback_loop(void)

{
  undefined *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t end_counter;
  uint64_t benchdone;
  uint64_t i;
  uint64_t benchstart;
  uint64_t start_counter;
  _func_void_void_ptr_uint64_t *counter_increment;
  
  puVar1 = (anonymous_namespace)::test_counter_add2;
  uVar2 = TestCounter::get();
  uVar3 = timestamp_benchmark();
  for (benchdone = 0; benchdone < 999999; benchdone = benchdone + 1) {
    (*(code *)puVar1)(0,1);
  }
  uVar4 = timestamp_benchmark();
  uVar5 = TestCounter::get();
  if (uVar5 - uVar2 == benchdone) {
    lVar6 = uVar4 - uVar3;
    auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)(benchdone >> 0x20);
    auVar8._0_8_ = benchdone;
    auVar8._12_4_ = 0x45300000;
    printf("OK\n  Benchmark: callback loop: %fns per round: ",
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)benchdone) - 4503599627370496.0)));
    return;
  }
  __assert_fail("end_counter - start_counter == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                ,0xd2,"void bench_callback_loop()");
}

Assistant:

static void
bench_callback_loop()
{
  void (*counter_increment) (void*, uint64_t) = test_counter_add2;
  const uint64_t start_counter = TestCounter::get();
  const uint64_t benchstart = timestamp_benchmark();
  uint64_t i;
  for (i = 0; i < 999999; i++)
    {
      counter_increment (nullptr, 1);
    }
  const uint64_t benchdone = timestamp_benchmark();
  const uint64_t end_counter = TestCounter::get();
  assert (end_counter - start_counter == i);
  printf ("OK\n  Benchmark: callback loop: %fns per round: ",
          size_t (benchdone - benchstart) * 1.0 / size_t (i));
}